

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

string * __thiscall
helics::core::to_string_abi_cxx11_(string *__return_storage_ptr__,core *this,CoreType type)

{
  int iVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    __s = "zmq_";
    __a = &local_b;
    break;
  case 2:
    __s = "mpi_";
    __a = &local_9;
    break;
  case 3:
    __s = "test_";
    __a = &local_a;
    break;
  case 4:
  case 5:
    __s = "ipc_";
    __a = &local_d;
    break;
  case 6:
    __s = "tcp_";
    __a = &local_e;
    break;
  case 7:
    __s = "udp_";
    __a = &local_11;
    break;
  case 8:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_002aa536_caseD_8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  case 9:
    __s = "nng_";
    __a = &local_12;
    break;
  case 10:
    __s = "zmqss_";
    __a = &local_c;
    break;
  case 0xb:
    __s = "tcpss_";
    __a = &local_f;
    break;
  case 0xc:
    __s = "http_";
    __a = &local_10;
    break;
  case 0xe:
    __s = "websocket_";
    __a = &local_14;
    break;
  case 0x12:
    __s = "inproc_";
    __a = &local_13;
    break;
  default:
    if (iVar1 == 0x42) {
      __s = "null_";
      __a = &local_15;
    }
    else {
      if (iVar1 != 0x4d) goto switchD_002aa536_caseD_8;
      __s = "empty_";
      __a = &local_16;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(CoreType type)
{
    switch (type) {
        case CoreType::MPI:
            return "mpi_";
        case CoreType::TEST:
            return "test_";
        case CoreType::ZMQ:
            return "zmq_";
        case CoreType::ZMQ_SS:
            return "zmqss_";
        case CoreType::INTERPROCESS:
        case CoreType::IPC:
            return "ipc_";
        case CoreType::TCP:
            return "tcp_";
        case CoreType::TCP_SS:
            return "tcpss_";
        case CoreType::HTTP:
            return "http_";
        case CoreType::UDP:
            return "udp_";
        case CoreType::NNG:
            return "nng_";
        case CoreType::INPROC:
            return "inproc_";
        case CoreType::WEBSOCKET:
            return "websocket_";
        case CoreType::NULLCORE:
            return "null_";
        case CoreType::EMPTY:
            return "empty_";
        default:
            return {};
    }
}